

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

void __thiscall webfront::fs::File::File(File *this,ifstream *ifstream)

{
  ifstream *in_RSI;
  undefined4 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = 0;
  http::std::span<const_unsigned_long,_18446744073709551615UL>::span
            ((span<const_unsigned_long,_18446744073709551615UL> *)0x12c75c);
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  std::ifstream::ifstream(in_RDI + 0x14,in_RSI);
  return;
}

Assistant:

File(std::ifstream ifstream) : fileType{FileType::nativeFStream}, fstream{std::move(ifstream)} {}